

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  bool bVar1;
  pointer _groupsCount;
  GroupInfo *in_RDX;
  RunContext *in_RDI;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_a0 [136];
  GroupInfo *local_18;
  
  local_18 = in_RDX;
  _groupsCount = clara::std::
                 unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                 ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                               *)0x12d648);
  GroupInfo::GroupInfo
            ((GroupInfo *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(size_t)in_RDI,(size_t)_groupsCount);
  bVar1 = aborting(in_RDI);
  TestGroupStats::TestGroupStats
            ((TestGroupStats *)
             CONCAT44(in_stack_ffffffffffffff24,CONCAT13(bVar1,(int3)in_stack_ffffffffffffff20)),
             local_18,(Totals *)in_RDI,SUB81((ulong)_groupsCount >> 0x38,0));
  (*_groupsCount->_vptr_IStreamingReporter[0xd])(_groupsCount,local_a0);
  TestGroupStats::~TestGroupStats((TestGroupStats *)0x12d6c9);
  GroupInfo::~GroupInfo((GroupInfo *)0x12d6d3);
  return;
}

Assistant:

void RunContext::testGroupEnded(std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupEnded(TestGroupStats(GroupInfo(testSpec, groupIndex, groupsCount), totals, aborting()));
    }